

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::getmaxsummaryid(aalcalc *this,string *path)

{
  int __status;
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  string filename;
  char line [4096];
  
  std::operator+(&filename,path,"max_summary_id.idx");
  __stream = fopen(filename._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL:%s: cannot open %s\n","getmaxsummaryid",filename._M_dataplus._M_p);
    __status = 1;
LAB_001033de:
    exit(__status);
  }
  pcVar2 = fgets(line,0x1000,__stream);
  if (pcVar2 != (char *)0x0) {
    uVar1 = __isoc99_sscanf(line,"%d",&this->max_summary_id_);
    if (uVar1 != 1) {
      fprintf(_stderr,"FATAL:Invalid data in line %d:\n%s %d",1,line,(ulong)uVar1);
      __status = -1;
      goto LAB_001033de;
    }
  }
  fclose(__stream);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void aalcalc::getmaxsummaryid(std::string &path)
{
	std::string filename = path + "max_summary_id.idx";
	FILE *fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	char line[4096];
	if (fgets(line, sizeof(line), fin) != 0)
	{
		int ret = sscanf(line, "%d", &max_summary_id_);
		if (ret != 1) {
			fprintf(stderr, "FATAL:Invalid data in line %d:\n%s %d", 1, line, ret);
			exit(-1);
		}		
	}

	fclose(fin);
}